

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderSAH<4,_embree::TriangleMv<4>_>::clear
          (BVHNBuilderSAH<4,_embree::TriangleMv<4>_> *this)

{
  size_t sVar1;
  PrimRef *ptr;
  MemoryMonitorInterface *pMVar2;
  
  sVar1 = (this->prims).size_alloced;
  ptr = (this->prims).items;
  if (ptr != (PrimRef *)0x0) {
    if (sVar1 << 5 < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,sVar1 << 5,(this->prims).alloc.hugepages);
    }
  }
  if (sVar1 != 0) {
    pMVar2 = (this->prims).alloc.device;
    (**pMVar2->_vptr_MemoryMonitorInterface)(pMVar2,sVar1 * -0x20,1);
  }
  (this->prims).size_active = 0;
  (this->prims).size_alloced = 0;
  (this->prims).items = (PrimRef *)0x0;
  return;
}

Assistant:

void clear() {
        prims.clear();
      }